

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

string * __thiscall
units::getCommodityName_abi_cxx11_(string *__return_storage_ptr__,units *this,uint32_t commodity)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  pointer pvVar4;
  char *pcVar5;
  char cVar6;
  string local_b8;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_4d;
  allocator local_39;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false> local_30;
  const_iterator fnd;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_20;
  iterator fnd2;
  uint32_t commodity_local;
  string *ret;
  
  fnd2.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_cur._4_4_ = (uint)this;
  bVar1 = std::atomic<bool>::load((atomic<bool> *)&allowCustomCommodities,memory_order_acquire);
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)customCommodityNames_abi_cxx11_), !bVar1)) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)customCommodityNames_abi_cxx11_,
                (key_type *)
                ((long)&fnd2.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        ._M_cur + 4));
    fnd.super__Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>._M_cur =
         (_Node_iterator_base<std::pair<const_unsigned_int,_const_char_*>,_false>)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)customCommodityNames_abi_cxx11_);
    bVar1 = std::__detail::operator!=
                      (&local_20,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        *)&fnd);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)&local_20);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar3->second);
      return __return_storage_ptr__;
    }
  }
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::find((unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
               *)commodities::commodity_names,
              (key_type *)
              ((long)&fnd2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur + 4));
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
       ::end((unordered_map<unsigned_int,_const_char_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>_>
              *)commodities::commodity_names);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    pvVar4 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_const_char_*>,_false,_false>
                         *)&local_30);
    pcVar5 = pvVar4->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else if ((fnd2.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur._4_4_ & 0x7c000000) == 0x40000000) {
    local_4d = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    cVar6 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
    while( true ) {
      uVar2 = std::__cxx11::string::empty();
      bVar1 = false;
      if ((uVar2 & 1) == 0) {
        pcVar5 = (char *)std::__cxx11::string::back();
        bVar1 = *pcVar5 == '_';
      }
      if (!bVar1) break;
      std::__cxx11::string::pop_back();
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"CXCOMM[",&local_91);
    std::__cxx11::to_string
              (&local_b8,
               fnd2.
               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               ._M_cur._4_4_);
    std::operator+(&local_70,&local_90,&local_b8);
    std::operator+(__return_storage_ptr__,&local_70,"]");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getCommodityName(std::uint32_t commodity)
{
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityNames.empty()) {
            auto fnd2 = customCommodityNames.find(commodity);
            if (fnd2 != customCommodityNames.end()) {
                return fnd2->second;
            }
        }
    }
    auto fnd = commodities::commodity_names.find(commodity);
    if (fnd != commodities::commodity_names.end()) {
        return fnd->second;
    }

    if ((commodity & 0x7C000000U) == 0x40000000U) {
        std::string ret;
        ret.push_back((commodity & 0X1FU) + '_');
        ret.push_back(((commodity >> 5U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 10U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 15U) & 0X1FU) + '_');
        ret.push_back(((commodity >> 20U) & 0X1FU) + '_');
        while (!ret.empty() && ret.back() == '_') {
            ret.pop_back();
        }
        return ret;
    }
    return std::string("CXCOMM[") + std::to_string(commodity) + "]";
}